

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O3

JL_STATUS ProcessTheStack(ProcessStack *Stack,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags)

{
  ProcessStack *pPVar1;
  JL_STATUS JVar2;
  uint uVar3;
  uint32_t StackDepth;
  JL_OUTPUT_FLAGS extraout_RDX;
  JL_OUTPUT_FLAGS extraout_RDX_00;
  JL_OUTPUT_FLAGS extraout_RDX_01;
  JL_OUTPUT_FLAGS extraout_RDX_02;
  JL_OUTPUT_FLAGS extraout_RDX_03;
  JL_OUTPUT_FLAGS OutputFlags_00;
  ulong uVar4;
  uint32_t stackDepth;
  uint32_t local_34;
  
  local_34 = 1;
  uVar4 = 1;
  OutputFlags_00 = OutputFlags;
  do {
    uVar3 = Stack[uVar4].ObjectType - JL_DATA_TYPE_STRING;
    if (4 < uVar3) {
      JVar2 = JL_STATUS_SUCCESS;
      goto LAB_00102dc7;
    }
    pPVar1 = Stack + uVar4;
    StackDepth = (&switchD_00102d6a::switchdataD_0010639c)[uVar3] + 0x10639c;
    switch(Stack[uVar4].ObjectType) {
    case JL_DATA_TYPE_STRING:
      JVar2 = OutputStringObject(pPVar1->Object,JsonBuffer,OutputFlags,StackDepth);
      OutputFlags_00 = extraout_RDX;
      break;
    case JL_DATA_TYPE_NUMBER:
      JVar2 = OutputNumberObject(pPVar1->Object,JsonBuffer,OutputFlags,StackDepth);
      OutputFlags_00 = extraout_RDX_03;
      break;
    case JL_DATA_TYPE_BOOL:
      JVar2 = OutputBoolObject(pPVar1->Object,JsonBuffer,OutputFlags_00,StackDepth);
      OutputFlags_00 = extraout_RDX_01;
      break;
    case JL_DATA_TYPE_LIST:
      JVar2 = ProcessListOnStack(Stack,&local_34,JsonBuffer,OutputFlags);
      OutputFlags_00 = extraout_RDX_02;
      goto LAB_00102dc7;
    case JL_DATA_TYPE_DICTIONARY:
      JVar2 = ProcessDictionaryOnStack(Stack,&local_34,JsonBuffer,OutputFlags);
      OutputFlags_00 = extraout_RDX_00;
      goto LAB_00102dc7;
    }
    local_34 = (int)uVar4 - 1;
LAB_00102dc7:
    uVar4 = (ulong)local_34;
    if ((local_34 == 0) || (JVar2 != JL_STATUS_SUCCESS)) {
      return JVar2;
    }
  } while( true );
}

Assistant:

JL_STATUS
    ProcessTheStack
    (
        ProcessStack*   Stack,
        JlBuffer*       JsonBuffer,
        JL_OUTPUT_FLAGS OutputFlags
    )
{
    JL_STATUS jlStatus;
    uint32_t stackDepth = 1;

    jlStatus = JL_STATUS_SUCCESS;

    while( stackDepth > 0  &&  JL_STATUS_SUCCESS == jlStatus )
    {
        // Process current deepest stack item
        ProcessStack* currentItem = &Stack[stackDepth];

        if( JL_DATA_TYPE_STRING == currentItem->ObjectType )
        {
            // String object. Output the string
            jlStatus = OutputStringObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_NUMBER == currentItem->ObjectType )
        {
            // Number object. Output the number
            jlStatus = OutputNumberObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_BOOL == currentItem->ObjectType )
        {
            // Boolean object. Output the boolean
            jlStatus = OutputBoolObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_LIST == currentItem->ObjectType )
        {
            jlStatus = ProcessListOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->ObjectType )
        {
            jlStatus = ProcessDictionaryOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }

    }

    return jlStatus;
}